

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O1

void __thiscall
Clasp::DefaultUnfoundedCheck::MinimalityCheck::schedNext(MinimalityCheck *this,uint32 level,bool ok)

{
  uint uVar1;
  uint32 uVar2;
  uint uVar3;
  uint uVar4;
  undefined3 in_register_00000011;
  double dVar5;
  
  this->low = 0;
  this->next = 0xffffffff;
  if (CONCAT31(in_register_00000011,ok) == 0) {
    this->high = level;
    uVar2 = 0;
  }
  else {
    uVar3 = *(uint *)&this->fwd >> 0x18 & 0x7f;
    if (uVar3 == 0) {
      return;
    }
    uVar1 = this->high;
    uVar4 = uVar1;
    if (uVar1 <= level) {
      uVar4 = level;
    }
    this->high = uVar4;
    this->low = level;
    if (uVar1 <= level) {
      this->high = uVar4 + (*(uint *)&this->fwd & 0xffffff);
    }
    dVar5 = ceil(((double)uVar3 / 100.0) * (double)(this->high - level));
    uVar2 = (int)(long)dVar5 + level;
  }
  this->next = uVar2;
  return;
}

Assistant:

void DefaultUnfoundedCheck::MinimalityCheck::schedNext(uint32 level, bool ok) {
	low  = 0;
	next = UINT32_MAX;
	if (!ok) {
		high = level;
		next = 0;
	}
	else if (fwd.highPct != 0) {
		double p = fwd.highPct / 100.0;
		high     = std::max(high, level);
		low      = level;
		if (low >= high) {
			high  += fwd.highStep;
		}
		next     = low + (uint32)std::ceil((high - low) * p);
	}
}